

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_write.cpp
# Opt level: O3

bool check_string(string *stra)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  
  uVar1 = stra->_M_string_length;
  if (uVar1 == 0) {
    return false;
  }
  pcVar2 = (stra->_M_dataplus)._M_p;
  bVar4 = true;
  if (*pcVar2 == ' ') {
    uVar3 = 1;
    do {
      uVar5 = uVar3;
      if (uVar1 == uVar5) break;
      uVar3 = uVar5 + 1;
    } while (pcVar2[uVar5] == ' ');
    bVar4 = uVar5 < uVar1;
  }
  return bVar4;
}

Assistant:

bool check_string(string stra)
{
	for (int i = 0; i < stra.length(); i++)
	{
		if (stra.at(i) != ' ')
		{
			return true;
		}
	}
	return false;
}